

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.hpp
# Opt level: O2

bool __thiscall
OpenMD::MoleculeStamp::
addIndexSensitiveStamp<std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>,OpenMD::FragmentStamp>
          (MoleculeStamp *this,
          vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *cont,
          FragmentStamp *stamp)

{
  pointer ppFVar1;
  const_iterator __position;
  ulong uVar2;
  ulong uVar3;
  value_type local_20;
  
  uVar3 = (ulong)(uint)stamp->index_;
  ppFVar1 = (cont->
            super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (cont->super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current - (long)ppFVar1 >> 3;
  if (uVar2 < stamp->index_ + 1) {
    local_20 = (value_type)0x0;
    std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::insert
              (cont,__position,(uVar3 - uVar2) + 1,&local_20);
    ppFVar1 = (cont->
              super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else if (ppFVar1[uVar3] != (FragmentStamp *)0x0) {
    return false;
  }
  ppFVar1[uVar3] = stamp;
  return true;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }